

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O3

void __thiscall
OpenMD::Polynomial<double>::addCoefficient
          (Polynomial<double> *this,int exponent,double *coefficient)

{
  _Rb_tree_header *p_Var1;
  mapped_type_conflict mVar2;
  _Base_ptr p_Var3;
  mapped_type_conflict *pmVar4;
  _Base_ptr p_Var5;
  int local_4;
  
  p_Var5 = (this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var1 = &(this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      if (exponent <= (int)p_Var5[1]._M_color) {
        p_Var3 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < exponent];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && ((int)p_Var3[1]._M_color <= exponent)) {
      p_Var3[1]._M_parent = (_Base_ptr)(*coefficient + (double)p_Var3[1]._M_parent);
      return;
    }
  }
  mVar2 = *coefficient;
  local_4 = exponent;
  pmVar4 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           operator[](&this->polyPairMap_,&local_4);
  *pmVar4 = mVar2;
  return;
}

Assistant:

void addCoefficient(int exponent, const Real& coefficient) {
      iterator i = polyPairMap_.find(exponent);

      if (i != end()) {
        i->second += coefficient;
      } else {
        setCoefficient(exponent, coefficient);
      }
    }